

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PredefinedIntegerType *type,string_view param_2)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  
  pcVar3 = (type->super_IntegralType).super_Type.super_Symbol.name._M_str;
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,pcVar3,
             pcVar3 + (type->super_IntegralType).super_Type.super_Symbol.name._M_len);
  bVar1 = (type->super_IntegralType).isSigned;
  bVar2 = PredefinedIntegerType::isDefaultSigned(type->integerKind);
  if (bVar1 == bVar2) {
    return;
  }
  bVar1 = (type->super_IntegralType).isSigned;
  pcVar3 = " unsigned";
  if (bVar1 != false) {
    pcVar3 = " signed";
  }
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,pcVar3,
             pcVar3 + (ulong)(bVar1 ^ 1) * 2 + 7);
  return;
}

Assistant:

void TypePrinter::visit(const PredefinedIntegerType& type, std::string_view) {
    buffer->append(type.name);
    if (type.isSigned != PredefinedIntegerType::isDefaultSigned(type.integerKind))
        buffer->append(type.isSigned ? " signed" : " unsigned");
}